

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_window_quantiles.cc
# Opt level: O0

void __thiscall
prometheus::detail::TimeWindowQuantiles::TimeWindowQuantiles
          (TimeWindowQuantiles *this,
          vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
          *quantiles,duration max_age,int age_buckets)

{
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar2;
  allocator<prometheus::detail::CKMSQuantiles> local_ff9;
  CKMSQuantiles local_ff8;
  int local_24;
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  *pvStack_20;
  int age_buckets_local;
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  *quantiles_local;
  TimeWindowQuantiles *this_local;
  duration max_age_local;
  
  this->quantiles_ = quantiles;
  local_24 = age_buckets;
  pvStack_20 = quantiles;
  quantiles_local =
       (vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
        *)this;
  this_local = (TimeWindowQuantiles *)max_age.__r;
  CKMSQuantiles::CKMSQuantiles(&local_ff8,this->quantiles_);
  std::allocator<prometheus::detail::CKMSQuantiles>::allocator(&local_ff9);
  std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
  ::vector(&this->ckms_quantiles_,(long)age_buckets,&local_ff8,&local_ff9);
  std::allocator<prometheus::detail::CKMSQuantiles>::~allocator(&local_ff9);
  CKMSQuantiles::~CKMSQuantiles(&local_ff8);
  this->current_bucket_ = 0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->last_rotation_).__d.__r = rVar1;
  dVar2 = std::chrono::operator/
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local,&local_24);
  (this->rotation_interval_).__r = dVar2.__r;
  return;
}

Assistant:

TimeWindowQuantiles::TimeWindowQuantiles(
    const std::vector<CKMSQuantiles::Quantile>& quantiles,
    const Clock::duration max_age, const int age_buckets)
    : quantiles_(quantiles),
      ckms_quantiles_(age_buckets, CKMSQuantiles(quantiles_)),
      current_bucket_(0),
      last_rotation_(Clock::now()),
      rotation_interval_(max_age / age_buckets) {}